

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sidebar.c
# Opt level: O0

nh_bool curses_list_items_core(nh_objitem *items,wchar_t icount,nh_bool invent,nh_bool draw)

{
  nh_objitem *pnVar1;
  nh_objitem **local_20;
  nh_objitem **list;
  nh_bool draw_local;
  nh_bool invent_local;
  wchar_t icount_local;
  nh_objitem *items_local;
  
  if (invent == '\0') {
    local_20 = &flooritems;
    floor_icount = icount;
  }
  else {
    local_20 = &inventory;
    inv_icount = icount;
  }
  free(*local_20);
  if (icount == L'\0') {
    *local_20 = (nh_objitem *)0x0;
  }
  else {
    pnVar1 = (nh_objitem *)malloc((long)icount * 0x124);
    *local_20 = pnVar1;
    memcpy(*local_20,items,(long)icount * 0x124);
  }
  if (draw != '\0') {
    draw_sidebar();
  }
  return ui_flags.draw_sidebar;
}

Assistant:

static nh_bool curses_list_items_core(struct nh_objitem *items, int icount,
			              nh_bool invent, nh_bool draw)
{
    struct nh_objitem **list;
    if (invent) {
	inv_icount = icount;
	list = &inventory;
    } else {
	floor_icount = icount;
	list = &flooritems;
    }
    
    free(*list);
    if (!icount)
	*list = NULL;
    else {
	*list = malloc(icount * sizeof(struct nh_objitem));
	memcpy(*list, items, icount * sizeof(struct nh_objitem));
    }
    
    if (draw)
	draw_sidebar();
    
    return ui_flags.draw_sidebar;
}